

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

void quat2R(Vector4d *q,Matrix3d *R)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = *(double *)q;
  dVar2 = *(double *)(q + 8);
  dVar7 = dVar2 + dVar2;
  dVar3 = *(double *)(q + 0x10);
  dVar4 = *(double *)(q + 0x18);
  dVar6 = dVar1 + dVar1;
  dVar5 = dVar1 * dVar1 - dVar2 * dVar2;
  (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       -dVar4 * dVar4 + dVar1 * dVar1 + dVar2 * dVar2 + -dVar3 * dVar3;
  (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1] =
       dVar6 * dVar4 + dVar7 * dVar3;
  (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar6 * dVar3 + dVar4 * dVar7;
  (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       (dVar3 + dVar3) * dVar4 + -dVar6 * dVar2;
  (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       dVar7 * dVar4 - dVar6 * dVar3;
  (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar7 * dVar3 - dVar6 * dVar4;
  (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       dVar4 * -dVar4 + dVar3 * dVar3 + dVar5;
  (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       dVar2 * dVar6 + (dVar3 + dVar3) * dVar4;
  (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       dVar4 * dVar4 + -dVar3 * dVar3 + dVar5;
  return;
}

Assistant:

void quat2R(Eigen::Vector4d const q, Eigen::Matrix3d & R) {
	double q1 = q(0);
	double q2 = q(1);
	double q3 = q(2);
	double q4 = q(3);

	R << q1*q1 + q2*q2 - q3*q3 - q4*q4, 2 * q2*q3 - 2 * q1*q4, 2 * q1*q3 + 2 * q2*q4,
		2 * q1*q4 + 2 * q2*q3, q1*q1 - q2*q2 + q3*q3 - q4*q4, 2 * q3*q4 - 2 * q1*q2,
		2 * q2*q4 - 2 * q1*q3, 2 * q1*q2 + 2 * q3*q4, q1*q1 - q2*q2 - q3*q3 + q4*q4;

}